

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O2

void __thiscall lsim::gui::CircuitEditor::draw_grid(CircuitEditor *this,ImDrawList *draw_list)

{
  Point PVar1;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Point win_pos;
  ImVec2 local_88;
  Point local_80;
  undefined1 local_78 [16];
  CircuitEditor *local_68;
  Point local_60;
  Point local_58;
  Point local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (this->m_show_grid == true) {
    local_88 = ImGui::GetCursorScreenPos();
    local_60 = ImVec2::operator_cast_to_Point(&local_88);
    local_88 = ImGui::GetWindowSize();
    PVar1 = ImVec2::operator_cast_to_Point(&local_88);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = PVar1.x;
    local_78._4_4_ = PVar1.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    local_68 = this;
    fVar2 = fmodf((this->m_scroll_delta).x,10.0);
    local_48 = (float)local_78._4_4_;
    fStack_44 = (float)local_78._4_4_;
    fStack_40 = (float)local_78._4_4_;
    fStack_3c = (float)local_78._4_4_;
    for (; fVar2 < (float)local_78._0_4_; fVar2 = fVar2 + 10.0) {
      Point::Point(&local_50,fVar2,0.0);
      local_88 = (ImVec2)Point::operator+(&local_50,&local_60);
      Point::Point(&local_58,fVar2,local_48);
      local_80 = Point::operator+(&local_58,&local_60);
      ImDrawList::AddLine(draw_list,&local_88,(ImVec2 *)&local_80,0x28c8c8c8,1.0);
    }
    fVar2 = fmodf((local_68->m_scroll_delta).y,10.0);
    for (; fVar2 < local_48; fVar2 = fVar2 + 10.0) {
      Point::Point(&local_50,0.0,fVar2);
      local_88 = (ImVec2)Point::operator+(&local_50,&local_60);
      Point::Point(&local_58,(float)local_78._0_4_,fVar2);
      local_80 = Point::operator+(&local_58,&local_60);
      ImDrawList::AddLine(draw_list,&local_88,(ImVec2 *)&local_80,0x28c8c8c8,1.0);
    }
  }
  return;
}

Assistant:

void CircuitEditor::draw_grid(ImDrawList *draw_list) {
	if (!m_show_grid) {
		return;
	}

	Point win_pos = ImGui::GetCursorScreenPos();
	Point win_size = ImGui::GetWindowSize();

	for (float x = fmodf(m_scroll_delta.x, GRID_SIZE); x < win_size.x; x += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(x, 0.0f) + win_pos, Point(x, win_size.y) + win_pos, COLOR_GRID_LINE);
	}

	for (float y = fmodf(m_scroll_delta.y, GRID_SIZE); y < win_size.y; y += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(0.0f, y) + win_pos, Point(win_size.x, y) + win_pos, COLOR_GRID_LINE);
	}
}